

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomTwo.cpp
# Opt level: O0

WhiteRoomTwo * __thiscall WhiteRoomTwo::getDescription_abi_cxx11_(WhiteRoomTwo *this,bool longform)

{
  itemLocation iVar1;
  ItemWrapper *this_00;
  byte in_DL;
  undefined7 in_register_00000031;
  long lVar2;
  itemType local_20;
  byte local_19;
  long lStack_18;
  bool longform_local;
  WhiteRoomTwo *this_local;
  
  lVar2 = CONCAT71(in_register_00000031,longform);
  local_19 = in_DL & 1;
  local_20 = POWER_CRYSTAL;
  lStack_18 = lVar2;
  this_local = this;
  this_00 = ItemTable::getValue(*(ItemTable **)(lVar2 + 0x108),&local_20);
  iVar1 = ItemWrapper::getLocation(this_00);
  if (iVar1 == BACKPACK) {
    std::__cxx11::string::string((string *)this,(string *)(lVar2 + 0x48));
  }
  else if ((local_19 & 1) == 0) {
    std::__cxx11::string::string((string *)this,(string *)(lVar2 + 0x28));
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)(lVar2 + 8));
  }
  return this;
}

Assistant:

std::string WhiteRoomTwo::getDescription(bool longform) {
    if(table->getValue(POWER_CRYSTAL)->getLocation() == BACKPACK){
        return rstate2;
    }
    else if(longform){
        return rstate0;
    }
    else {
        return rstate1;
    }
}